

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FieldDescriptor::default_value_enum(FieldDescriptor *this)

{
  FieldDescriptor *local_10;
  
  if (this->type_once_ != (once_flag *)0x0) {
    local_10 = this;
    absl::lts_20250127::
    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (this->type_once_,TypeOnceInit,&local_10);
  }
  return (EnumValueDescriptor *)(this->field_20).default_value_int64_t_;
}

Assistant:

const EnumValueDescriptor* FieldDescriptor::default_value_enum() const {
  if (type_once_) {
    absl::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
  }
  return default_value_enum_;
}